

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O3

curl_slist * curl_slist_append(curl_slist *list,char *data)

{
  curl_slist *pcVar1;
  char *pcVar2;
  curl_slist *pcVar3;
  curl_slist *pcVar4;
  
  pcVar2 = (*Curl_cstrdup)(data);
  if (pcVar2 != (char *)0x0) {
    pcVar3 = (curl_slist *)(*Curl_cmalloc)(0x10);
    if (pcVar3 != (curl_slist *)0x0) {
      pcVar3->next = (curl_slist *)0x0;
      pcVar3->data = pcVar2;
      pcVar1 = list;
      if (list == (curl_slist *)0x0) {
        return pcVar3;
      }
      do {
        pcVar4 = pcVar1;
        pcVar1 = pcVar4->next;
      } while (pcVar1 != (curl_slist *)0x0);
      pcVar4->next = pcVar3;
      return list;
    }
    (*Curl_cfree)(pcVar2);
  }
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *curl_slist_append(struct curl_slist *list,
                                     const char *data)
{
  char *dupdata = strdup(data);

  if(!dupdata)
    return NULL;

  list = Curl_slist_append_nodup(list, dupdata);
  if(!list)
    free(dupdata);

  return list;
}